

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws.c
# Opt level: O0

CURLcode Curl_ws_request(Curl_easy *data,dynbuf *req)

{
  CURLcode CVar1;
  size_t thislen;
  char *pcVar2;
  undefined8 local_c8;
  wsfield heads [4];
  SingleRequest *k;
  char keyval [40];
  ulong local_48;
  size_t randlen;
  char *randstr;
  uchar rand [16];
  CURLcode result;
  uint i;
  dynbuf *req_local;
  Curl_easy *data_local;
  
  rand[8] = '\0';
  rand[9] = '\0';
  rand[10] = '\0';
  rand[0xb] = '\0';
  memcpy(&local_c8,&DAT_001eba00,0x40);
  heads[3].name = (char *)&k;
  rand._8_4_ = Curl_rand_bytes(data,(uchar *)&randstr,0x10);
  data_local._4_4_ = rand._8_4_;
  if ((rand._8_4_ == CURLE_OK) &&
     (rand._8_4_ = Curl_base64_encode((char *)&randstr,0x10,(char **)&randlen,&local_48),
     data_local._4_4_ = rand._8_4_, rand._8_4_ == CURLE_OK)) {
    if (local_48 < 0x28) {
      strcpy((char *)&k,(char *)randlen);
      (*Curl_cfree)((void *)randlen);
      rand[0xc] = '\0';
      rand[0xd] = '\0';
      rand[0xe] = '\0';
      rand[0xf] = '\0';
      for (; rand._8_4_ == 0 && (uint)rand._12_4_ < 4; rand._12_4_ = rand._12_4_ + 1) {
        pcVar2 = heads[(ulong)(uint)rand._12_4_ - 1].val;
        thislen = strlen(heads[(ulong)(uint)rand._12_4_ - 1].val);
        pcVar2 = Curl_checkheaders(data,pcVar2,thislen);
        if (pcVar2 == (char *)0x0) {
          CVar1 = Curl_dyn_addf(req,"%s: %s\r\n",heads[(ulong)(uint)rand._12_4_ - 1].val,
                                heads[(uint)rand._12_4_].name);
          rand[8] = (char)CVar1;
          rand[9] = (char)(CVar1 >> 8);
          rand[10] = (char)(CVar1 >> 0x10);
          rand[0xb] = (char)(CVar1 >> 0x18);
        }
      }
      (data->req).upgr101 = UPGR101_WS;
      data_local._4_1_ = rand[8];
      data_local._5_1_ = rand[9];
      data_local._6_1_ = rand[10];
      data_local._7_1_ = rand[0xb];
    }
    else {
      (*Curl_cfree)((void *)randlen);
      data_local._4_4_ = CURLE_FAILED_INIT;
    }
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_ws_request(struct Curl_easy *data, struct dynbuf *req)
{
  unsigned int i;
  CURLcode result = CURLE_OK;
  unsigned char rand[16];
  char *randstr;
  size_t randlen;
  char keyval[40];
  struct SingleRequest *k = &data->req;
  struct wsfield heads[]= {
    {
      /* The request MUST contain an |Upgrade| header field whose value
         MUST include the "websocket" keyword. */
      "Upgrade", "websocket"
    },
    {
      /* The request MUST contain a |Connection| header field whose value
         MUST include the "Upgrade" token. */
      "Connection", "Upgrade",
    },
    {
      /* The request MUST include a header field with the name
         |Sec-WebSocket-Version|. The value of this header field MUST be
         13. */
      "Sec-WebSocket-Version", "13",
    },
    {
      /* The request MUST include a header field with the name
         |Sec-WebSocket-Key|. The value of this header field MUST be a nonce
         consisting of a randomly selected 16-byte value that has been
         base64-encoded (see Section 4 of [RFC4648]). The nonce MUST be
         selected randomly for each connection. */
      "Sec-WebSocket-Key", NULL,
    }
  };
  heads[3].val = &keyval[0];

  /* 16 bytes random */
  result = Curl_rand(data, (unsigned char *)rand, sizeof(rand));
  if(result)
    return result;
  result = Curl_base64_encode((char *)rand, sizeof(rand), &randstr, &randlen);
  if(result)
    return result;
  DEBUGASSERT(randlen < sizeof(keyval));
  if(randlen >= sizeof(keyval)) {
    free(randstr);
    return CURLE_FAILED_INIT;
  }
  strcpy(keyval, randstr);
  free(randstr);
  for(i = 0; !result && (i < CURL_ARRAYSIZE(heads)); i++) {
    if(!Curl_checkheaders(data, heads[i].name, strlen(heads[i].name))) {
      result = Curl_dyn_addf(req, "%s: %s\r\n", heads[i].name,
                             heads[i].val);
    }
  }
  k->upgr101 = UPGR101_WS;
  return result;
}